

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::ConcreteMachine
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this,Target *target,
          ROMFetcher *rom_fetcher)

{
  int iVar1;
  bool bVar2;
  SourceT *sample_source;
  undefined4 *puVar3;
  DiskIICard *this_00;
  SCSICard *this_01;
  Mockingboard *this_02;
  pointer ppVar4;
  size_type sVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_03;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_208;
  uchar *local_200;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1f0;
  const_iterator local_1e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  const_iterator local_1d8;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1d0;
  undefined1 local_1c8 [8];
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request local_170;
  byte local_141;
  undefined1 local_140 [7];
  bool has_scsi_card;
  Request local_118;
  byte local_ea;
  byte local_e9;
  undefined1 local_e8 [6];
  bool is_sixteen_sector;
  bool has_disk_controller;
  Request local_c0;
  undefined1 local_98 [8];
  Request request;
  key_type local_68;
  Name system;
  Name character;
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_58;
  ROMFetcher *local_20;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this_local;
  
  local_20 = rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  II::Machine::Machine(&this->super_Machine);
  MachineTypes::TimedMachine::TimedMachine(&this->super_TimedMachine);
  MachineTypes::ScanProducer::ScanProducer(&this->super_ScanProducer);
  MachineTypes::AudioProducer::AudioProducer(&this->super_AudioProducer);
  MachineTypes::MediaTarget::MediaTarget(&this->super_MediaTarget);
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set(&local_58);
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,&local_58);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set(&local_58);
  MachineTypes::JoystickMachine::JoystickMachine(&this->super_JoystickMachine);
  Configurable::Device::Device(&this->super_Device);
  Activity::Source::Source(&this->super_Source);
  Card::Delegate::Delegate(&this->super_Delegate);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00c99a28;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00c99ad8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00c99b20;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00c99b58;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00c99b70;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00c99b88;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00c99bb8;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00c99bf8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00c99c10;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00c99c30;
  (this->super_Delegate)._vptr_Delegate =
       (_func_int **)&PTR_card_did_change_select_constraints_00c99c48;
  CPU::MOS6502::
  Processor<(CPU::MOS6502::Personality)1,_Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>,_false>
  ::Processor(&this->m6502_,this);
  VideoBusHandler::VideoBusHandler(&this->video_bus_handler_,this->ram_,this->aux_ram_);
  II::Video::
  Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::VideoBusHandler,_false>
  ::Video(&this->video_,&this->video_bus_handler_);
  this->cycles_into_current_line_ = 0;
  Cycles::Cycles(&this->cycles_since_video_update_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->rom_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  Audio::Toggle::Toggle(&this->audio_toggle_,&this->audio_queue_);
  anon_unknown.dwarf_759566::StretchedAYPair::AYPair(&this->ays_,&this->audio_queue_);
  Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>::
  CompoundSource(&this->mixer_,&this->ays_,&this->audio_toggle_);
  sample_source = lowpass_source(this);
  Outputs::Speaker::
  PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>
  ::PullLowpass(&this->speaker_,sample_source);
  Cycles::Cycles(&this->cycles_since_audio_update_);
  this->active_card_ = 7;
  std::array<std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>,_8UL>::array
            (&this->cards_);
  Cycles::Cycles(&this->cycles_since_card_update_);
  std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::vector
            (&this->every_cycle_cards_);
  std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::vector
            (&this->just_in_time_cards_);
  this->stretched_cycles_since_card_update_ = 0;
  this->card_lists_are_dirty_ = true;
  this->card_became_just_in_time_ = false;
  LanguageCardSwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>_>
  ::LanguageCardSwitches(&this->language_card_,this);
  AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>_>
  ::AuxiliaryMemorySwitches(&this->auxiliary_switches_,this);
  Keyboard::Keyboard(&this->keyboard_,&this->m6502_);
  JoystickPair::JoystickPair(&this->joysticks_);
  MachineTypes::TimedMachine::set_clock_rate(&this->super_TimedMachine,1020484.3201754387);
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
  ::set_input_rate(&(this->speaker_).
                    super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
                   ,7.15909e+06);
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
  ::set_high_frequency_cutoff
            (&(this->speaker_).
              super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
             ,6000.0);
  Memory::Fuzz(this->ram_,0x10000);
  Memory::Fuzz(this->aux_ram_,0x10000);
  iVar1 = *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 8);
  if (iVar1 == 1) {
    local_68 = AppleIICharacter;
    request.node.children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = AppleIIPlus;
  }
  else if (iVar1 == 2) {
    local_68 = AppleIIeCharacter;
    request.node.children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = AppleIIe;
  }
  else if (iVar1 == 3) {
    local_68 = AppleIIEnhancedECharacter;
    request.node.children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = AppleIIEnhancedE;
  }
  else {
    local_68 = AppleIICharacter;
    request.node.children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = AppleIIOriginal;
  }
  ROM::Request::Request(&local_c0,local_68,false);
  ROM::Request::Request
            ((Request *)local_e8,
             request.node.children.
             super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,false);
  ROM::Request::operator&&((Request *)local_98,&local_c0,(Request *)local_e8);
  ROM::Request::~Request((Request *)local_e8);
  ROM::Request::~Request(&local_c0);
  local_e9 = *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 0xc) != 0;
  local_ea = *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 0xc) == 1;
  if ((bool)local_e9) {
    DiskIICard::rom_request((Request *)local_140,(bool)local_ea);
    ROM::Request::operator&&(&local_118,(Request *)local_98,(Request *)local_140);
    ROM::Request::operator=((Request *)local_98,&local_118);
    ROM::Request::~Request(&local_118);
    ROM::Request::~Request((Request *)local_140);
  }
  local_141 = *(int *)&rom_fetcher_local[4].super__Function_base._M_manager == 1;
  if ((bool)local_141) {
    SCSICard::rom_request();
    ROM::Request::operator&&
              (&local_170,(Request *)local_98,
               (Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ROM::Request::operator=((Request *)local_98,&local_170);
    ROM::Request::~Request(&local_170);
    ROM::Request::~Request((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_1c8,local_20,(Request *)local_98);
  bVar2 = ROM::Request::validate((Request *)local_98,(Map *)local_1c8);
  if (bVar2) {
    if ((local_e9 & 1) != 0) {
      this_00 = (DiskIICard *)operator_new(0x478);
      DiskIICard::DiskIICard(this_00,(Map *)local_1c8,(bool)(local_ea & 1));
      install_card(this,6,(Card *)this_00);
    }
    if ((local_141 & 1) != 0) {
      this_01 = (SCSICard *)operator_new(0x61d8);
      SCSICard::SCSICard(this_01,(Map *)local_1c8,0xf9b07);
      install_card(this,7,(Card *)this_01);
    }
    if (((ulong)rom_fetcher_local[4].super__Function_base._M_manager & 0x100000000) != 0) {
      this_02 = (Mockingboard *)operator_new(0x108);
      Mockingboard::Mockingboard(this_02,&(this->ays_).super_AYPair);
      install_card(this,4,(Card *)this_02);
    }
    local_1d0._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)local_1c8,
                (key_type *)
                ((long)&request.node.children.
                        super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_1d0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->rom_,&ppVar4->second);
    if (((request.node.children.
          super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == AppleIIe) ||
        (request.node.children.
         super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ == AppleIIEnhancedE)) &&
       (sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->rom_),
       0x3f00 < sVar5)) {
      this_03 = &this->rom_;
      local_1e0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_03);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_1d8,&local_1e0);
      local_1f8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_03);
      local_1f0 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator-(&local_1f8,0x3f00);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_1e8,&local_1f0);
      local_200 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                     (this_03,local_1d8,local_1e8);
    }
    local_208._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)local_1c8,&local_68);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_208);
    VideoSwitches<Cycles>::set_character_rom((VideoSwitches<Cycles> *)&this->video_,&ppVar4->second)
    ;
    set_paging<3>(this);
    page(this,0xc0,0xd0,(uint8_t *)0x0,(uint8_t *)0x0);
    insert_media(this,(Media *)&rom_fetcher_local->_M_invoker);
    std::
    map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~map((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)local_1c8);
    ROM::Request::~Request((Request *)local_98);
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(const Analyser::Static::AppleII::Target &target, const ROMMachine::ROMFetcher &rom_fetcher):
			m6502_(*this),
			video_bus_handler_(ram_, aux_ram_),
			video_(video_bus_handler_),
			audio_toggle_(audio_queue_),
			ays_(audio_queue_),
			mixer_(ays_, audio_toggle_),
			speaker_(lowpass_source()),
			language_card_(*this),
			auxiliary_switches_(*this),
			keyboard_(&m6502_) {

			// This is where things get slightly convoluted: establish the machine as having a clock rate
			// equal to the number of cycles of work the 6502 will actually achieve. Which is less than
			// the master clock rate divided by 14 because every 65th cycle is extended by one seventh.
			set_clock_rate((master_clock / 14.0) * 65.0 / (65.0 + 1.0 / 7.0));

			// The speaker, however, should think it is clocked at half the master clock, per a general
			// decision to sample it at seven times the CPU clock (plus stretches).
			speaker_.set_input_rate(float(master_clock / (2.0 * float(audio_divider))));

			// Apply a 6Khz low-pass filter. This was picked by ear and by an attempt to understand the
			// Apple II schematic but, well, I don't claim much insight on the latter. This is definitely
			// something to review in the future.
			speaker_.set_high_frequency_cutoff(6000);

			// Also, start with randomised memory contents.
			Memory::Fuzz(ram_, sizeof(ram_));
			Memory::Fuzz(aux_ram_, sizeof(aux_ram_));

			// Pick the required ROMs.
			using Target = Analyser::Static::AppleII::Target;
			ROM::Name character, system;

			switch(target.model) {
				default:
					character = ROM::Name::AppleIICharacter;
					system = ROM::Name::AppleIIOriginal;
				break;
				case Target::Model::IIplus:
					character = ROM::Name::AppleIICharacter;
					system = ROM::Name::AppleIIPlus;
				break;
				case Target::Model::IIe:
					character = ROM::Name::AppleIIeCharacter;
					system = ROM::Name::AppleIIe;
				break;
				case Target::Model::EnhancedIIe:
					character = ROM::Name::AppleIIEnhancedECharacter;
					system = ROM::Name::AppleIIEnhancedE;
				break;
			}

			ROM::Request request = ROM::Request(character) && ROM::Request(system);

			// Add the necessary Disk II requests if appropriate.
			const bool has_disk_controller = target.disk_controller != Target::DiskController::None;
			const bool is_sixteen_sector = target.disk_controller == Target::DiskController::SixteenSector;
			if(has_disk_controller) {
				request = request && DiskIICard::rom_request(is_sixteen_sector);
			}

			// Add a SCSI card if requested.
			const bool has_scsi_card = target.scsi_controller == Target::SCSIController::AppleSCSI;
			if(has_scsi_card) {
				request = request && SCSICard::rom_request();
			}

			// Request, validate and install ROMs.
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			if(has_disk_controller) {
				install_card(DiskIISlot, new Apple::II::DiskIICard(roms, is_sixteen_sector));
			}

			if(has_scsi_card) {
				// Rounding the clock rate slightly shouldn't matter, but:
				// TODO: be [slightly] more honest about clock rate.
				install_card(SCSISlot, new Apple::II::SCSICard(roms, int(master_clock / 14.0f)));
			}

			if(target.has_mockingboard) {
				// The Mockingboard has a parasitic relationship with this class due to the way
				// that audio outputs are implemented in this emulator.
				install_card(MockingboardSlot, new Apple::II::Mockingboard(ays_));
			}

			rom_ = std::move(roms.find(system)->second);
			// The IIe and Enhanced IIe ROMs often distributed are oversized; trim if necessary.
			if(system == ROM::Name::AppleIIe || system == ROM::Name::AppleIIEnhancedE) {
				if(rom_.size() > 16128) {
					rom_.erase(rom_.begin(), rom_.end() - 16128);
				}
			}
			video_.set_character_rom(roms.find(character)->second);

			// Set up the default memory blocks. On a II or II+ these values will never change.
			// On a IIe they'll be affected by selection of auxiliary RAM.
			set_paging<PagingType::Main | PagingType::ZeroPage>();

			// Set the whole card area to initially backed by nothing.
			page(0xc0, 0xd0, nullptr, nullptr);

			insert_media(target.media);
		}